

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int JS_DefinePropertyValue(JSContext *ctx,JSValue this_obj,JSAtom prop,JSValue val,int flags)

{
  JSValue getter;
  JSValue setter;
  int iVar1;
  undefined4 uStack_3c;
  undefined4 uStack_2c;
  
  getter.tag = 3;
  getter.u.ptr = (void *)((ulong)uStack_2c << 0x20);
  setter.tag = 3;
  setter.u.ptr = (void *)((ulong)uStack_3c << 0x20);
  iVar1 = JS_DefineProperty(ctx,this_obj,prop,val,getter,setter,flags | 0x2700);
  JS_FreeValue(ctx,val);
  return iVar1;
}

Assistant:

int JS_DefinePropertyValue(JSContext *ctx, JSValueConst this_obj,
                           JSAtom prop, JSValue val, int flags)
{
    int ret;
    ret = JS_DefineProperty(ctx, this_obj, prop, val, JS_UNDEFINED, JS_UNDEFINED,
                            flags | JS_PROP_HAS_VALUE | JS_PROP_HAS_CONFIGURABLE | JS_PROP_HAS_WRITABLE | JS_PROP_HAS_ENUMERABLE);
    JS_FreeValue(ctx, val);
    return ret;
}